

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O0

bool __thiscall xray_re::xr_mesh_builder::b_face::is_duplicate(b_face *this,b_face *face)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  bool local_41;
  uint_fast32_t i2;
  uint_fast32_t i1;
  uint_fast32_t i0;
  b_face *face_local;
  b_face *this_local;
  
  i1 = 0;
  while( true ) {
    if (i1 == 3) {
      return false;
    }
    if ((this->field_0).__refs[i1] == (face->field_0).field_0.v[0]) break;
    i1 = i1 + 1;
  }
  uVar2 = 1 << ((byte)i1 & 0x1f) & 3;
  lVar3 = (long)(int)uVar2;
  lVar4 = (long)(int)(1 << (sbyte)uVar2 & 3);
  local_41 = false;
  if ((((this->field_0).__refs[lVar3] == (face->field_0).field_0.v[1]) &&
      (local_41 = false, (this->field_0).__refs[lVar4] == (face->field_0).field_0.v[2])) &&
     (local_41 = false, this->sector == face->sector)) {
    bVar1 = xr_raw_surface::operator==(&(this->field_1).surface,&(face->field_1).surface);
    local_41 = false;
    if ((((bVar1) &&
         (local_41 = false,
         *(uint32_t *)((long)&this->field_0 + i1 * 4 + 0xc) == (face->field_0).field_0.n[0])) &&
        ((local_41 = false,
         *(uint32_t *)((long)&this->field_0 + lVar3 * 4 + 0xc) == (face->field_0).field_0.n[1] &&
         ((local_41 = false,
          *(uint32_t *)((long)&this->field_0 + lVar4 * 4 + 0xc) == (face->field_0).field_0.n[2] &&
          (local_41 = false,
          *(uint32_t *)((long)&this->field_0 + i1 * 4 + 0x18) == (face->field_0).field_0.tc[0]))))))
       && (local_41 = false,
          *(uint32_t *)((long)&this->field_0 + lVar3 * 4 + 0x18) == (face->field_0).field_0.tc[1]))
    {
      local_41 = *(uint32_t *)((long)&this->field_0 + lVar4 * 4 + 0x18) ==
                 (face->field_0).field_0.tc[2];
    }
  }
  return local_41;
}

Assistant:

bool xr_mesh_builder::b_face::is_duplicate(const b_face& face) const
{
	for (uint_fast32_t i0 = 0; i0 != 3; ++i0) {
		if (v[i0] != face.v0)
			continue;
		uint_fast32_t i1 = (1 << i0) & 3;
		uint_fast32_t i2 = (1 << i1) & 3;
		return v[i1] == face.v1 && v[i2] == face.v2 &&
				sector == face.sector && surface == face.surface &&
				n[i0] == face.n0 && n[i1] == face.n1 && n[i2] == face.n2 &&
				tc[i0] == face.tc0 && tc[i1] == face.tc1 && tc[i2] == face.tc2;
	}
	return false;
}